

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O1

_Bool has_property(artifact *art,object *obj,char *prop_name)

{
  byte bVar1;
  _Bool *p_Var2;
  char *pcVar3;
  _Bool _Var4;
  short sVar5;
  int iVar6;
  obj_property *poVar7;
  char *pcVar8;
  object_kind *poVar9;
  int16_t *piVar10;
  short sVar11;
  bitflag *flags;
  element_info *peVar12;
  _Bool **pp_Var13;
  ulong uVar14;
  int16_t *piVar15;
  bool bVar16;
  wchar_t sval;
  wchar_t tval;
  ulong uVar17;
  char **ppcVar18;
  bool bVar19;
  bool bVar20;
  
  poVar7 = lookup_obj_property_name(prop_name);
  if (poVar7 == (obj_property *)0x0) {
    __assert_fail("prop",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-design.c"
                  ,100,"_Bool has_property(struct artifact *, struct object *, const char *)");
  }
  if (art == (artifact *)0x0 && obj == (object *)0x0) {
    __assert_fail("art || ((art == NULL) && obj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-design.c"
                  ,0x65,"_Bool has_property(struct artifact *, struct object *, const char *)");
  }
  switch(poVar7->type) {
  case L'\x01':
  case L'\x02':
    piVar10 = obj->modifiers;
    if (art != (artifact *)0x0) {
      piVar10 = art->modifiers;
    }
    if (piVar10[poVar7->index] != 0) {
      return true;
    }
    break;
  case L'\x03':
    flags = obj->flags;
    if (art != (artifact *)0x0) {
      flags = art->flags;
    }
    _Var4 = flag_has_dbg(flags,6,poVar7->index,"flags","prop->index");
    if (_Var4) {
      return true;
    }
    break;
  case L'\x04':
    peVar12 = obj->el_info;
    if (art != (artifact *)0x0) {
      peVar12 = art->el_info;
    }
    if (peVar12[poVar7->index].res_level != 100) {
      return true;
    }
    break;
  case L'\x05':
    peVar12 = obj->el_info;
    if (art != (artifact *)0x0) {
      peVar12 = art->el_info;
    }
    if ((peVar12[poVar7->index].flags & 2) != 0) {
      return true;
    }
    break;
  case L'\x06':
    pp_Var13 = &obj->brands;
    if (art != (artifact *)0x0) {
      pp_Var13 = &art->brands;
    }
    p_Var2 = *pp_Var13;
    bVar16 = p_Var2 != (_Bool *)0x0;
    if (p_Var2 == (_Bool *)0x0) {
      return bVar16;
    }
    uVar17 = (ulong)z_info->brand_max;
    bVar19 = uVar17 < 2;
    if (!bVar19) {
      pcVar3 = poVar7->name;
      ppcVar18 = &brands[1].name;
      uVar14 = 2;
      do {
        pcVar8 = strstr(pcVar3,*ppcVar18);
        if ((pcVar8 != (char *)0x0) && (p_Var2[uVar14 - 1] != false)) {
LAB_0019576d:
          if (bVar19) {
            return false;
          }
          return bVar16;
        }
        bVar19 = uVar17 <= uVar14;
        ppcVar18 = ppcVar18 + 6;
        bVar20 = uVar14 != uVar17;
        uVar14 = uVar14 + 1;
      } while (bVar20);
    }
    break;
  case L'\a':
    pp_Var13 = &obj->slays;
    if (art != (artifact *)0x0) {
      pp_Var13 = &art->slays;
    }
    p_Var2 = *pp_Var13;
    bVar16 = p_Var2 != (_Bool *)0x0;
    if (p_Var2 == (_Bool *)0x0) {
      return bVar16;
    }
    uVar17 = (ulong)z_info->slay_max;
    bVar19 = uVar17 < 2;
    if (!bVar19) {
      pcVar3 = poVar7->name;
      ppcVar18 = &slays[1].name;
      uVar14 = 2;
      do {
        pcVar8 = strstr(pcVar3,*ppcVar18);
        if ((pcVar8 != (char *)0x0) && (p_Var2[uVar14 - 1] != false)) goto LAB_0019576d;
        bVar19 = uVar17 <= uVar14;
        ppcVar18 = ppcVar18 + 7;
        bVar20 = uVar14 != uVar17;
        uVar14 = uVar14 + 1;
      } while (bVar20);
    }
    break;
  case L'\b':
    if (art == (artifact *)0x0) {
      tval = (wchar_t)obj->tval;
      sval = (wchar_t)obj->sval;
    }
    else {
      tval = art->tval;
      sval = art->sval;
    }
    poVar9 = lookup_kind(tval,sval);
    pcVar3 = poVar7->name;
    iVar6 = strcmp(pcVar3,"enhanced dice");
    if (iVar6 == 0) {
      if (art == (artifact *)0x0) {
        if (poVar9->dd < (int)(uint)obj->dd) {
          return true;
        }
        bVar1 = obj->ds;
      }
      else {
        if (poVar9->dd < (int)(uint)art->dd) {
          return true;
        }
        bVar1 = art->ds;
      }
      if ((int)(uint)bVar1 <= poVar9->ds) {
        return false;
      }
      return true;
    }
    iVar6 = strcmp(pcVar3,"extra armor");
    if (iVar6 == 0) {
      piVar10 = &obj->ac;
      if (art != (artifact *)0x0) {
        piVar10 = &art->ac;
      }
      sVar5 = *piVar10;
      sVar11 = (short)poVar9->ac;
    }
    else {
      iVar6 = strcmp(pcVar3,"armor bonus");
      if (iVar6 == 0) {
        piVar10 = &art->to_a;
        piVar15 = &obj->to_a;
      }
      else {
        iVar6 = strcmp(pcVar3,"skill bonus");
        if (iVar6 != 0) {
          iVar6 = strcmp(pcVar3,"deadliness bonus");
          sVar11 = 0;
          if (iVar6 == 0) {
            piVar10 = &obj->to_d;
            if (art != (artifact *)0x0) {
              piVar10 = &art->to_d;
            }
            sVar5 = *piVar10;
          }
          else {
            sVar5 = 0;
            sVar11 = 0;
          }
          goto LAB_001957c5;
        }
        piVar10 = &art->to_h;
        piVar15 = &obj->to_h;
      }
      if (art != (artifact *)0x0) {
        piVar15 = piVar10;
      }
      sVar5 = *piVar15;
      sVar11 = 0;
    }
LAB_001957c5:
    if (sVar11 != sVar5) {
      return true;
    }
    break;
  default:
    msg("error -- object property not recognized.");
  }
  return false;
}

Assistant:

static bool has_property(struct artifact *art, struct object *obj,
						 const char *prop_name)
{
	struct obj_property *prop = lookup_obj_property_name(prop_name);
	assert(prop);
	assert(art || ((art == NULL) && obj));

	switch (prop->type) {
		case OBJ_PROPERTY_STAT:
		case OBJ_PROPERTY_MOD:
		{
			int16_t *modifiers = art ? art->modifiers : obj->modifiers;
			if (modifiers[prop->index] != 0) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_FLAG:
		{
			bitflag *flags = art ? art->flags : obj->flags;
			if (of_has(flags, prop->index)) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_ELEMENT:
		{
			struct element_info *el_info = art ? art->el_info : obj->el_info;
			if (el_info[prop->index].res_level != RES_LEVEL_BASE) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_IGNORE:
		{
			struct element_info *el_info = art ? art->el_info : obj->el_info;
			if (el_info[prop->index].flags & EL_INFO_IGNORE) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_BRAND:
		{
			bool *b = art ? art->brands : obj->brands;
			int pick;

			/* See if there are any brands, if so get the correct one */
			if (!b) return false;
			for (pick = 1; pick < z_info->brand_max; pick++) {
				if (strstr(prop->name, brands[pick].name) && b[pick])
					break;
			}

			if (pick < z_info->brand_max) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_SLAY:
		{
			bool *s = art ? art->slays : obj->slays;
			int pick;

			/* See if there are any slays, if so get the correct one */
			if (!s) return false;
			for (pick = 1; pick < z_info->slay_max; pick++) {
				if (strstr(prop->name, slays[pick].name) && s[pick])
					break;
			}

			if (pick < z_info->slay_max) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_COMBAT:
		{
			/* Get the object kind to compare */
			struct object_kind *kind = art ? lookup_kind(art->tval, art->sval)
				: lookup_kind(obj->tval, obj->sval);

			/* Enhanced dice require special calculations */
			if (streq(prop->name, "enhanced dice")) {
				if (art) {
					if ((art->dd > kind->dd) || (art->ds > kind->ds)) {
						return true;
					}
				} else if ((obj->dd > kind->dd) || (obj->ds > kind->ds)) {
					return true;
				}
			} else {
				/* Various things get checked to here */
				int16_t bonus = 0, standard = 0;
				if (streq(prop->name, "extra armor")) {
					bonus = art ? art->ac : obj->ac;
					standard = kind->ac;
				} else if (streq(prop->name, "armor bonus")) {
					bonus = art ? art->to_a : obj->to_a;
				} else if (streq(prop->name, "skill bonus")) {
					bonus = art ? art->to_h : obj->to_h;
				} else if (streq(prop->name, "deadliness bonus")) {
					bonus = art ? art->to_d : obj->to_d;
				}
				if (bonus != standard) {
					return true;
				}
			}
			break;
		}

		default: msg("error -- object property not recognized."); break;
	}

	return false;
}